

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean skip_variable(j_decompress_ptr cinfo)

{
  byte bVar1;
  jpeg_source_mgr *pjVar2;
  boolean bVar3;
  long lVar4;
  size_t local_38;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  INT32 length;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->src;
  bytes_in_buffer = (size_t)pjVar2->next_input_byte;
  local_38 = pjVar2->bytes_in_buffer;
  if (local_38 == 0) {
    bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar3 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    local_38 = pjVar2->bytes_in_buffer;
  }
  local_38 = local_38 - 1;
  bVar1 = *(byte *)bytes_in_buffer;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (local_38 == 0) {
    bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar3 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    local_38 = pjVar2->bytes_in_buffer;
  }
  lVar4 = (ulong)*(byte *)bytes_in_buffer + (ulong)bVar1 * 0x100 + -2;
  cinfo->err->msg_code = 0x5d;
  (cinfo->err->msg_parm).i[0] = cinfo->unread_marker;
  (cinfo->err->msg_parm).i[1] = (int)lVar4;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  pjVar2->next_input_byte = (JOCTET *)(bytes_in_buffer + 1);
  pjVar2->bytes_in_buffer = local_38 - 1;
  if (0 < lVar4) {
    (*cinfo->src->skip_input_data)(cinfo,lVar4);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
skip_variable (j_decompress_ptr cinfo)
/* Skip over an unknown or uninteresting variable-length marker */
{
  INT32 length;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;
  
  TRACEMS2(cinfo, 1, JTRC_MISC_MARKER, cinfo->unread_marker, (int) length);

  INPUT_SYNC(cinfo);		/* do before skip_input_data */
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long) length);

  return TRUE;
}